

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  bool bVar1;
  pointer local_30;
  second_type local_28;
  
  local_28.field_1 = symbol.field_1;
  local_28.type = symbol.type;
  local_30 = (full_name->_M_dataplus)._M_p;
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<char_const*,google::protobuf::Symbol,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::Symbol>>>>
                    (&this->symbols_by_name_,&local_30,&local_28);
  if (bVar1) {
    local_30 = (full_name->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_,
               &local_30);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}